

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  uchar local_19;
  uint local_18;
  uint local_14;
  uint num_bits_local;
  uint bits_local;
  symbol_codec *this_local;
  
  if (num_bits != 0) {
    this->m_bit_count = this->m_bit_count - num_bits;
    this->m_bit_buf = bits << ((byte)this->m_bit_count & 0x1f) | this->m_bit_buf;
    this->m_total_bits_written = num_bits + this->m_total_bits_written;
    local_18 = num_bits;
    local_14 = bits;
    _num_bits_local = this;
    while (this->m_bit_count < 0x19) {
      local_19 = (uchar)(this->m_bit_buf >> 0x18);
      vector<unsigned_char>::push_back(&this->m_output_buf,&local_19);
      this->m_bit_buf = this->m_bit_buf << 8;
      this->m_bit_count = this->m_bit_count + 8;
    }
  }
  return;
}

Assistant:

void symbol_codec::put_bits(uint bits, uint num_bits) {
  CRNLIB_ASSERT(num_bits <= 25);
  CRNLIB_ASSERT(m_bit_count >= 25);

  if (!num_bits)
    return;

  m_bit_count -= num_bits;
  m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

  m_total_bits_written += num_bits;

  while (m_bit_count <= (cBitBufSize - 8)) {
    m_output_buf.push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8)));

    m_bit_buf <<= 8;
    m_bit_count += 8;
  }
}